

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectCreation.h
# Opt level: O3

Expression * CreateObject(PrimitiveSimpleObject *object)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int value;
  ExpressionList *this;
  ConstExpression *this_00;
  EseqExpression *this_01;
  MoveStatement *this_02;
  TempExpression *pTVar2;
  CallExpression *this_03;
  NameExpression *this_04;
  Temporary tmp;
  string local_d0;
  Temporary local_b0;
  Temporary local_90;
  Temporary local_70;
  Label local_50;
  
  this = (ExpressionList *)operator_new(0x20);
  (this->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ExpressionList_0016cf38;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (ConstExpression *)operator_new(0x10);
  value = (*(object->super_PrimitiveObject).super_Object._vptr_Object[3])(object);
  IRT::ConstExpression::ConstExpression(this_00,value);
  IRT::ExpressionList::Add(this,(Expression *)this_00);
  IRT::Temporary::Temporary(&local_90);
  this_01 = (EseqExpression *)operator_new(0x18);
  this_02 = (MoveStatement *)operator_new(0x18);
  pTVar2 = (TempExpression *)operator_new(0x28);
  local_b0.name_._M_dataplus._M_p = (pointer)&local_b0.name_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_90.name_._M_dataplus._M_p,
             local_90.name_._M_dataplus._M_p + local_90.name_._M_string_length);
  IRT::TempExpression::TempExpression(pTVar2,&local_b0);
  this_03 = (CallExpression *)operator_new(0x18);
  this_04 = (NameExpression *)operator_new(0x28);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"malloc","");
  IRT::Label::Label(&local_50,&local_d0);
  IRT::NameExpression::NameExpression(this_04,&local_50);
  IRT::CallExpression::CallExpression(this_03,(Expression *)this_04,this);
  IRT::MoveStatement::MoveStatement(this_02,(Expression *)pTVar2,(Expression *)this_03);
  pTVar2 = (TempExpression *)operator_new(0x28);
  paVar1 = &local_70.name_.field_2;
  local_70.name_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_90.name_._M_dataplus._M_p,
             local_90.name_._M_dataplus._M_p + local_90.name_._M_string_length);
  IRT::TempExpression::TempExpression(pTVar2,&local_70);
  IRT::EseqExpression::EseqExpression(this_01,(Statement *)this_02,(Expression *)pTVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.name_._M_dataplus._M_p,local_70.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.label_._M_dataplus._M_p != &local_50.label_.field_2) {
    operator_delete(local_50.label_._M_dataplus._M_p,
                    local_50.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.name_._M_dataplus._M_p != &local_b0.name_.field_2) {
    operator_delete(local_b0.name_._M_dataplus._M_p,local_b0.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.name_._M_dataplus._M_p != &local_90.name_.field_2) {
    operator_delete(local_90.name_._M_dataplus._M_p,local_90.name_.field_2._M_allocated_capacity + 1
                   );
  }
  return &this_01->super_Expression;
}

Assistant:

IRT::Expression* CreateObject(PrimitiveSimpleObject* object) {
  auto* irt_expressions = new IRT::ExpressionList();
  irt_expressions->Add(new IRT::ConstExpression(object->GetSize()));

  IRT::Temporary tmp;
  return new IRT::EseqExpression(
      new IRT::MoveStatement(
          new IRT::TempExpression(tmp),
          new IRT::CallExpression(new IRT::NameExpression(IRT::Label("malloc")),
                                  irt_expressions)),
      new IRT::TempExpression(tmp));
}